

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O1

void __thiscall
SuiteMessageTests::TestsetStringWithHeaderGroup::RunImpl(TestsetStringWithHeaderGroup *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestResults *results;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  Message object;
  DataDictionary dataDictionary;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  TestDetails local_570;
  Message local_550 [344];
  DataDictionary local_3f8 [1000];
  
  FIX::Message::Message(local_550);
  paVar1 = &local_590.field_2;
  local_590._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,"../spec/FIX43.xml","");
  FIX::DataDictionary::DataDictionary(local_3f8,(string *)&local_590,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != paVar1) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_590,RunImpl::str,(allocator<char> *)&local_570);
  FIX::Message::setString((string *)local_550,SUB81(&local_590,0),(DataDictionary *)0x1,local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != paVar1) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  ppTVar2 = UnitTest::CurrentTest::Results();
  results = *ppTVar2;
  FIX::Message::toString_abi_cxx11_((int)&local_590,(int)local_550,8);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_570,*ppTVar3,0xf1);
  UnitTest::CheckEqual<char_const*,std::__cxx11::string>
            (results,&RunImpl::str,&local_590,&local_570);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != paVar1) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  FIX::DataDictionary::~DataDictionary(local_3f8);
  FIX::Message::~Message(local_550);
  return;
}

Assistant:

TEST(setStringWithHeaderGroup)
{
  FIX::Message object;
  DataDictionary dataDictionary( "../spec/FIX43.xml" );
  static const char* str =
    "8=FIX.4.3\0019=152\00135=A\00134=125\00149=BUYSIDE\001"
    "52=20040916-16:19:18.328\00156=SELLSIDE\001"
    "627=2\001628=HOP1\001629=20040916-16:19:18.328\001630=ID1\001"
    "628=HOP2\001629=20040916-16:19:18.328\001630=ID2\001"
    "10=079\001";

  object.setString( str, true, &dataDictionary );
  CHECK_EQUAL( str, object.toString() );
}